

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

int __thiscall Catch::Session::runInternal(Session *this)

{
  size_type *psVar1;
  const_iterator __position;
  element_type *peVar2;
  long lVar3;
  TestCase **ppTVar4;
  pointer pTVar5;
  _func_int **pp_Var6;
  undefined8 uVar7;
  pointer pbVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
  *pSVar12;
  undefined4 extraout_var;
  long *plVar13;
  long lVar14;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var15;
  size_type *psVar16;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *testCases;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  _Base_ptr p_Var17;
  char *pcVar18;
  ostream *poVar19;
  const_iterator __begin3_1;
  _func_int **pp_Var20;
  pointer *__ptr;
  int iVar21;
  TestCase **__v;
  pointer pFVar22;
  undefined8 *puVar23;
  iterator __begin3;
  size_type sVar24;
  pointer pTVar25;
  pointer pbVar26;
  pointer *__x;
  undefined1 auVar27 [12];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tags;
  Totals totals;
  string filename;
  _Head_base<0UL,_Catch::IStreamingReporter_*,_false> local_358;
  undefined8 *local_350;
  vector<std::unique_ptr<Catch::IStreamingReporter,std::default_delete<Catch::IStreamingReporter>>,std::allocator<std::unique_ptr<Catch::IStreamingReporter,std::default_delete<Catch::IStreamingReporter>>>>
  *local_348;
  _Head_base<0UL,_Catch::IStreamingReporter_*,_false> local_340;
  undefined1 local_338 [16];
  undefined1 local_328 [48];
  undefined1 local_2f8 [32];
  char *pcStack_2d8;
  undefined1 local_2d0 [24];
  undefined1 local_2b8 [24];
  pointer local_2a0;
  SourceLineInfo local_298;
  element_type *local_280;
  undefined1 local_278 [240];
  long *local_188;
  ulong local_168;
  long *local_140;
  undefined1 local_78 [48];
  undefined1 auStack_48 [16];
  _Alloc_hider _Stack_38;
  
  if (this->m_startupExceptions != false) {
    return 1;
  }
  if ((this->m_configData).showHelp != false) {
    return 0;
  }
  if ((this->m_configData).libIdentify != false) {
    return 0;
  }
  config(this);
  seedRng(&((this->m_config).super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           super_IConfig);
  local_2a0 = (pointer)&this->m_config;
  if ((this->m_configData).filenamesAsTags == true) {
    peVar2 = (((shared_ptr<Catch::Config> *)local_2a0)->
             super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    pSVar12 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
              ::getInternal();
    iVar10 = (*(pSVar12->super_RegistryHub).super_IRegistryHub._vptr_IRegistryHub[3])(pSVar12);
    plVar13 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar10) + 0x18))
                                ((long *)CONCAT44(extraout_var,iVar10),peVar2);
    lVar3 = plVar13[1];
    if (*plVar13 != lVar3) {
      __x = (pointer *)(*plVar13 + 0x60);
      do {
        CLI::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_338,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)__x);
        std::__cxx11::string::string
                  ((string *)local_278,
                   (char *)(((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)(__x + 6))->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start,(allocator *)&local_358);
        lVar14 = std::__cxx11::string::find_last_of((char *)local_278,0x21121f,0xffffffffffffffff);
        if (lVar14 == -1) {
          std::__cxx11::string::replace((ulong)local_278,0,(char *)0x0,0x20f6b5);
        }
        else {
          std::__cxx11::string::erase((ulong)local_278,0);
          *(char *)local_278._0_8_ = '#';
        }
        p_Var15 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  std::__cxx11::string::rfind
                            ((char)(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_278,0x2e);
        if (p_Var15 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xffffffffffffffff) {
          if ((ulong)local_278._8_8_ < p_Var15) {
            auVar27 = std::__throw_out_of_range_fmt
                                ("%s: __pos (which is %zu) > this->size() (which is %zu)",
                                 "basic_string::erase",p_Var15);
            if ((element_type *)local_338._8_8_ != (element_type *)0x0) {
              CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_338._8_8_);
            }
            if ((pointer)local_2f8._8_8_ != (pointer)0x0) {
              CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2f8._8_8_);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._8_8_);
            }
            if (auVar27._8_4_ == 1) {
              plVar13 = (long *)__cxa_begin_catch(auVar27._0_8_);
              pcVar18 = (char *)(**(code **)(*plVar13 + 0x10))(plVar13);
              poVar19 = std::operator<<((ostream *)&std::cerr,pcVar18);
              std::endl<char,std::char_traits<char>>(poVar19);
              __cxa_end_catch();
              return 0xff;
            }
            _Unwind_Resume(auVar27._0_8_);
          }
          *(char *)(local_278._0_8_ + (long)p_Var15) = '\0';
          local_278._8_8_ = p_Var15;
        }
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_338,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_278);
        CLI::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_2f8,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_338);
        setTags((TestCaseInfo *)(__x + -0xc),
                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_2f8);
        CLI::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_2f8);
        if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
          operator_delete((void *)local_278._0_8_);
        }
        CLI::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_338);
        lVar14 = (long)(__x + 0xb);
        __x = __x + 0x17;
      } while (lVar14 != lVar3);
    }
  }
  list((Catch *)local_278,(shared_ptr<Catch::Config> *)local_2a0);
  if ((int *)local_278._0_8_ != (int *)0x0) {
    if (0xfe < *(int *)local_278._0_8_) {
      return 0xff;
    }
    return *(int *)local_278._0_8_;
  }
  local_278._0_8_ =
       (this->m_config).super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_278._8_8_ =
       (this->m_config).super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  local_2f8._0_4_ = (undefined4)local_278._0_8_;
  local_2f8._4_4_ = (undefined4)((ulong)local_278._0_8_ >> 0x20);
  if ((pointer)local_278._8_8_ == (pointer)0x0) {
    local_2f8._8_8_ = (pointer)0x0;
    goto LAB_001cd219;
  }
  if (__libc_single_threaded == '\0') {
    LOCK();
    *(int *)&((pointer)local_278._8_8_)->_M_string_length =
         (int)((pointer)local_278._8_8_)->_M_string_length + 1;
    UNLOCK();
    peVar2 = (this->m_config).super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_2f8._8_8_ =
         (this->m_config).super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
         _M_pi;
    local_2f8._0_4_ = SUB84(peVar2,0);
    local_2f8._4_4_ = (undefined4)((ulong)peVar2 >> 0x20);
    if ((pointer)local_2f8._8_8_ == (pointer)0x0) goto LAB_001cd219;
    psVar16 = &((pointer)local_2f8._8_8_)->_M_string_length;
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)psVar16 = (int)*psVar16 + 1;
      UNLOCK();
      goto LAB_001cd219;
    }
  }
  else {
    *(int *)&((pointer)local_278._8_8_)->_M_string_length =
         (int)((pointer)local_278._8_8_)->_M_string_length + 1;
    psVar16 = &((pointer)local_278._8_8_)->_M_string_length;
    local_2f8._8_8_ = local_278._8_8_;
  }
  *(int *)psVar16 = (int)*psVar16 + 1;
LAB_001cd219:
  pSVar12 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
            ::getInternal();
  iVar10 = (*(pSVar12->super_RegistryHub).super_IRegistryHub._vptr_IRegistryHub[2])(pSVar12);
  plVar13 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_00,iVar10) + 0x20))
                              ((long *)CONCAT44(extraout_var_00,iVar10));
  if (*plVar13 == plVar13[1]) {
    local_338._0_8_ =
         (this->m_config).super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_338._8_8_ =
         (this->m_config).super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
         _M_pi;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_338._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_338._8_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_338._8_8_)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_338._8_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_338._8_8_)->_M_use_count + 1;
      }
    }
    anon_unknown_1::createReporter
              ((anon_unknown_1 *)&local_340,
               &(((element_type *)local_338._0_8_)->m_data).reporterName,(IConfigPtr *)local_338);
  }
  else {
    local_340._M_head_impl = (IStreamingReporter *)operator_new(0x30);
    (local_340._M_head_impl)->_vptr_IStreamingReporter =
         (_func_int **)&PTR__ListeningReporter_0025ec40;
    *(undefined1 (*) [16])(local_340._M_head_impl + 1) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])(local_340._M_head_impl + 3) = (undefined1  [16])0x0;
    *(undefined2 *)&local_340._M_head_impl[5]._vptr_IStreamingReporter = 0x100;
    local_2b8._0_8_ = local_340._M_head_impl;
    pSVar12 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
              ::getInternal();
    iVar10 = (*(pSVar12->super_RegistryHub).super_IRegistryHub._vptr_IRegistryHub[2])(pSVar12);
    plVar13 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_01,iVar10) + 0x20))
                                ((long *)CONCAT44(extraout_var_01,iVar10));
    puVar23 = (undefined8 *)*plVar13;
    local_350 = (undefined8 *)plVar13[1];
    if (puVar23 != local_350) {
      local_348 = (vector<std::unique_ptr<Catch::IStreamingReporter,std::default_delete<Catch::IStreamingReporter>>,std::allocator<std::unique_ptr<Catch::IStreamingReporter,std::default_delete<Catch::IStreamingReporter>>>>
                   *)(local_2b8._0_8_ + 8);
      do {
        plVar13 = (long *)*puVar23;
        peVar2 = (this->m_config).super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        pFVar22 = (pointer)(this->m_config).
                           super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                           ._M_pi;
        if (pFVar22 != (pointer)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            psVar1 = &(pFVar22->name)._M_string_length;
            *(int *)psVar1 = (int)*psVar1 + 1;
            UNLOCK();
          }
          else {
            psVar1 = &(pFVar22->name)._M_string_length;
            *(int *)psVar1 = (int)*psVar1 + 1;
          }
        }
        iVar10 = (*(peVar2->super_IConfig).super_NonCopyable._vptr_NonCopyable[3])(peVar2);
        local_338._0_8_ = CONCAT44(extraout_var_02,iVar10);
        if (pFVar22 != (pointer)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            psVar1 = &(pFVar22->name)._M_string_length;
            *(int *)psVar1 = (int)*psVar1 + 1;
            UNLOCK();
          }
          else {
            psVar1 = &(pFVar22->name)._M_string_length;
            *(int *)psVar1 = (int)*psVar1 + 1;
          }
        }
        local_338._8_8_ = peVar2;
        local_328._0_8_ = pFVar22;
        (**(code **)(*plVar13 + 0x10))(&local_358,plVar13,local_338);
        std::
        vector<std::unique_ptr<Catch::IStreamingReporter,std::default_delete<Catch::IStreamingReporter>>,std::allocator<std::unique_ptr<Catch::IStreamingReporter,std::default_delete<Catch::IStreamingReporter>>>>
        ::
        emplace_back<std::unique_ptr<Catch::IStreamingReporter,std::default_delete<Catch::IStreamingReporter>>>
                  (local_348,
                   (unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
                    *)&local_358);
        if (local_358._M_head_impl != (IStreamingReporter *)0x0) {
          (*(local_358._M_head_impl)->_vptr_IStreamingReporter[1])();
        }
        local_358._M_head_impl = (IStreamingReporter *)0x0;
        if ((pointer)local_328._0_8_ != (pointer)0x0) {
          CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_328._0_8_);
        }
        if (pFVar22 != (pointer)0x0) {
          CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pFVar22);
        }
        puVar23 = puVar23 + 2;
      } while (puVar23 != local_350);
    }
    local_338._0_8_ =
         (this->m_config).super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_338._8_8_ =
         (this->m_config).super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
         _M_pi;
    uVar7 = local_2b8._0_8_;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_338._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_338._8_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_338._8_8_)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_338._8_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_338._8_8_)->_M_use_count + 1;
      }
    }
    anon_unknown_1::createReporter
              ((anon_unknown_1 *)&local_358,
               &(((element_type *)local_338._0_8_)->m_data).reporterName,(IConfigPtr *)local_338);
    ListeningReporter::addReporter((ListeningReporter *)uVar7,(IStreamingReporterPtr *)&local_358);
    if (local_358._M_head_impl != (IStreamingReporter *)0x0) {
      (*(local_358._M_head_impl)->_vptr_IStreamingReporter[1])();
    }
    local_358._M_head_impl = (IStreamingReporter *)0x0;
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_338._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_338._8_8_);
  }
  RunContext::RunContext
            ((RunContext *)(local_278 + 0x10),(IConfigPtr *)local_2f8,
             (IStreamingReporterPtr *)&local_340);
  if (local_340._M_head_impl != (IStreamingReporter *)0x0) {
    (*(local_340._M_head_impl)->_vptr_IStreamingReporter[1])();
  }
  if ((pointer)local_2f8._8_8_ != (pointer)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2f8._8_8_);
  }
  uVar7 = local_278._0_8_;
  __position._M_node = (_Base_ptr)(local_78 + 8);
  local_78._8_4_ = 0;
  local_78._16_8_ = 0;
  stack0xffffffffffffffb0 = (undefined1  [16])0x0;
  stack0xffffffffffffffc0 = (undefined1  [16])0x0;
  local_78._24_8_ = __position._M_node;
  local_78._32_8_ = __position._M_node;
  pSVar12 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
            ::getInternal();
  iVar10 = (*(pSVar12->super_RegistryHub).super_IRegistryHub._vptr_IRegistryHub[3])(pSVar12);
  testCases = (vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)
              (**(code **)(*(long *)CONCAT44(extraout_var_03,iVar10) + 0x18))
                        ((long *)CONCAT44(extraout_var_03,iVar10),uVar7);
  iVar10 = (**(code **)(*(long *)local_278._0_8_ + 0x68))();
  TestSpec::matchesByFilter
            ((Matches *)local_2f8,(TestSpec *)CONCAT44(extraout_var_04,iVar10),testCases,
             (IConfig *)local_278._0_8_);
  local_328._0_8_ = _Stack_38._M_p;
  sVar24 = CONCAT44(local_2f8._4_4_,local_2f8._0_4_);
  local_338._8_8_ = auStack_48._8_8_;
  _Stack_38._M_p = (pointer)local_2f8._16_8_;
  auStack_48._8_8_ = local_2f8._8_8_;
  local_338._0_8_ = auStack_48._0_8_;
  local_2f8._0_4_ = 0;
  local_2f8._4_4_ = 0;
  local_2f8._8_8_ = (pointer)0x0;
  local_2f8._16_8_ = (pointer)0x0;
  auStack_48._0_8_ = sVar24;
  clara::std::vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>::
  ~vector((vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_> *)
          local_338);
  clara::std::vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>::
  ~vector((vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_> *)
          local_2f8);
  iVar10 = (**(code **)(*(long *)local_278._0_8_ + 0x68))();
  local_350 = (undefined8 *)auStack_48._8_8_;
  if (auStack_48._0_8_ == auStack_48._8_8_) {
    if (*(long *)(CONCAT44(extraout_var_05,iVar10) + 0x18) ==
        *(long *)(CONCAT44(extraout_var_05,iVar10) + 0x20)) {
      pTVar25 = (testCases->super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>).
                _M_impl.super__Vector_impl_data._M_start;
      pTVar5 = (testCases->super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>).
               _M_impl.super__Vector_impl_data._M_finish;
      if (pTVar25 != pTVar5) {
        do {
          if (((pTVar25->super_TestCaseInfo).properties & IsHidden) == None) {
            local_338._0_8_ = pTVar25;
            std::
            _Rb_tree<Catch::TestCase_const*,Catch::TestCase_const*,std::_Identity<Catch::TestCase_const*>,std::less<Catch::TestCase_const*>,std::allocator<Catch::TestCase_const*>>
            ::_M_emplace_unique<Catch::TestCase_const*>
                      ((_Rb_tree<Catch::TestCase_const*,Catch::TestCase_const*,std::_Identity<Catch::TestCase_const*>,std::less<Catch::TestCase_const*>,std::allocator<Catch::TestCase_const*>>
                        *)local_78,(TestCase **)local_338);
          }
          pTVar25 = pTVar25 + 1;
        } while (pTVar25 != pTVar5);
      }
    }
  }
  else {
    sVar24 = auStack_48._0_8_;
    do {
      ppTVar4 = *(TestCase ***)(sVar24 + 0x28);
      local_338._0_8_ = (pointer)local_78;
      for (__v = *(TestCase ***)(sVar24 + 0x20); __v != ppTVar4; __v = __v + 1) {
        std::
        _Rb_tree<Catch::TestCase_const*,Catch::TestCase_const*,std::_Identity<Catch::TestCase_const*>,std::less<Catch::TestCase_const*>,std::allocator<Catch::TestCase_const*>>
        ::
        _M_insert_unique_<Catch::TestCase_const*const&,std::_Rb_tree<Catch::TestCase_const*,Catch::TestCase_const*,std::_Identity<Catch::TestCase_const*>,std::less<Catch::TestCase_const*>,std::allocator<Catch::TestCase_const*>>::_Alloc_node>
                  ((_Rb_tree<Catch::TestCase_const*,Catch::TestCase_const*,std::_Identity<Catch::TestCase_const*>,std::less<Catch::TestCase_const*>,std::allocator<Catch::TestCase_const*>>
                    *)local_78,__position,__v,(_Alloc_node *)local_338);
      }
      sVar24 = sVar24 + 0x38;
    } while ((undefined8 *)sVar24 != local_350);
  }
  iVar10 = (**(code **)(*(long *)local_278._0_8_ + 0x68))();
  local_2f8._0_4_ = 0;
  local_2f8._8_8_ = (pointer)0x0;
  local_2f8._16_8_ = (pointer)0x0;
  stack0xfffffffffffffd20 = (undefined1  [16])0x0;
  local_2d0._0_16_ = (undefined1  [16])0x0;
  (**(code **)(*(long *)local_278._0_8_ + 0x20))(local_338);
  RunContext::testGroupStarting((RunContext *)(local_278 + 0x10),(string *)local_338,1,1);
  if ((pointer)local_338._0_8_ != (pointer)local_328) {
    operator_delete((void *)local_338._0_8_);
  }
  pFVar22 = (pointer)0x0;
  local_280 = (element_type *)CONCAT44(extraout_var_06,iVar10);
  if ((_Base_ptr)local_78._24_8_ != __position._M_node) {
    local_2b8._0_16_ = (undefined1  [16])0x0;
    local_348 = (vector<std::unique_ptr<Catch::IStreamingReporter,std::default_delete<Catch::IStreamingReporter>>,std::allocator<std::unique_ptr<Catch::IStreamingReporter,std::default_delete<Catch::IStreamingReporter>>>>
                 *)0x0;
    local_350 = (undefined8 *)0x0;
    pFVar22 = (pointer)0x0;
    pbVar26 = (pointer)0x0;
    local_298.file = (char *)0x0;
    local_298.line = 0;
    p_Var17 = (_Base_ptr)local_78._24_8_;
    do {
      uVar9 = local_168;
      iVar10 = (**(code **)(*local_188 + 0x48))();
      if (uVar9 < (ulong)(long)iVar10) {
        RunContext::runTest((Totals *)local_338,(RunContext *)(local_278 + 0x10),
                            *(TestCase **)(p_Var17 + 1));
        pbVar26 = (pointer)((long)&(pbVar26->_M_dataplus)._M_p + local_338._8_8_);
        pFVar22 = (pointer)((long)&(pFVar22->name)._M_dataplus._M_p + local_328._0_8_);
        local_350 = (undefined8 *)((long)local_350 + local_328._8_8_);
        local_298.file = (char *)((long)&((_Alloc_hider *)local_2b8._0_8_)->_M_p + local_328._16_8_)
        ;
        local_298.line = (long)&((_Alloc_hider *)local_2b8._8_8_)->_M_p + local_328._24_8_;
        local_348 = local_348 + local_328._32_8_;
        local_2b8._8_8_ = local_298.line;
        local_2b8._0_8_ = local_298.file;
      }
      else {
        (**(code **)(*local_140 + 0x78))(local_140,*(undefined8 *)(p_Var17 + 1));
      }
      p_Var17 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var17);
    } while (p_Var17 != __position._M_node);
    pcStack_2d8 = local_298.file;
    local_2f8._24_8_ = local_350;
    local_2d0._8_8_ = local_348;
    local_2d0._0_8_ = local_298.line;
    local_2f8._8_8_ = pbVar26;
    local_2f8._16_8_ = pFVar22;
  }
  iVar21 = 0;
  uVar7 = auStack_48._8_8_;
  iVar10 = local_2f8._0_4_;
  if (auStack_48._0_8_ != auStack_48._8_8_) {
    iVar21 = 0;
    sVar24 = auStack_48._0_8_;
    do {
      if (*(long *)(sVar24 + 0x20) == *(long *)(sVar24 + 0x28)) {
        iVar21 = -1;
        (**(code **)(*local_140 + 0x18))(local_140,sVar24);
      }
      sVar24 = sVar24 + 0x38;
      iVar10 = iVar21;
    } while (sVar24 != uVar7);
  }
  local_2f8._0_4_ = iVar10;
  pp_Var6 = local_280[4]._vptr_ITestInvoker;
  for (pp_Var20 = local_280[3]._vptr_ITestInvoker; pp_Var20 != pp_Var6; pp_Var20 = pp_Var20 + 4) {
    (**(code **)(*local_140 + 0x20))(local_140,pp_Var20);
  }
  (**(code **)(*(long *)local_278._0_8_ + 0x20))(local_338);
  RunContext::testGroupEnded
            ((RunContext *)(local_278 + 0x10),(string *)local_338,(Totals *)local_2f8,1,1);
  pbVar8 = local_2a0;
  if ((pointer)local_338._0_8_ != (pointer)local_328) {
    operator_delete((void *)local_338._0_8_);
  }
  iVar11 = (*(((__shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2> *)&pbVar8->_M_dataplus)->
              _M_ptr->super_IConfig).super_NonCopyable._vptr_NonCopyable[8])();
  iVar10 = 2;
  if (((byte)iVar11 & iVar21 == -1) == 0) {
    iVar10 = (int)pFVar22;
    if ((int)pFVar22 < iVar21) {
      iVar10 = iVar21;
    }
    if (0xfe < iVar10) {
      iVar10 = 0xff;
    }
  }
  clara::std::vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>::
  ~vector((vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_> *)
          auStack_48);
  clara::std::
  _Rb_tree<const_Catch::TestCase_*,_const_Catch::TestCase_*,_std::_Identity<const_Catch::TestCase_*>,_std::less<const_Catch::TestCase_*>,_std::allocator<const_Catch::TestCase_*>_>
  ::~_Rb_tree((_Rb_tree<const_Catch::TestCase_*,_const_Catch::TestCase_*,_std::_Identity<const_Catch::TestCase_*>,_std::less<const_Catch::TestCase_*>,_std::allocator<const_Catch::TestCase_*>_>
               *)local_78);
  RunContext::~RunContext((RunContext *)(local_278 + 0x10));
  if ((pointer)local_278._8_8_ != (pointer)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._8_8_);
  }
  return iVar10;
}

Assistant:

int Session::runInternal() {
        if( m_startupExceptions )
            return 1;

        if (m_configData.showHelp || m_configData.libIdentify) {
            return 0;
        }

        CATCH_TRY {
            config(); // Force config to be constructed

            seedRng( *m_config );

            if( m_configData.filenamesAsTags )
                applyFilenamesAsTags( *m_config );

            // Handle list request
            if( Option<std::size_t> listed = list( m_config ) )
                return (std::min) (MaxExitCode, static_cast<int>(*listed));

            TestGroup tests { m_config };
            auto const totals = tests.execute();

            if( m_config->warnAboutNoTests() && totals.error == -1 )
                return 2;

            // Note that on unices only the lower 8 bits are usually used, clamping
            // the return value to 255 prevents false negative when some multiple
            // of 256 tests has failed
            return (std::min) (MaxExitCode, (std::max) (totals.error, static_cast<int>(totals.assertions.failed)));
        }